

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O2

void csp_send_direct(csp_id_t_conflict *idout,csp_packet_t *packet,csp_iface_t *routed_from)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  csp_iface_t *pcVar4;
  csp_packet_t *pcVar5;
  uint from_me;
  bool bVar6;
  csp_id_t_conflict _idout;
  csp_id_t_conflict local_38;
  
  from_me = (uint)(routed_from == (csp_iface_t *)0x0);
  if (idout->dst == csp_if_lo.addr) {
    csp_send_direct_iface(idout,packet,&csp_if_lo,0xffff,from_me);
    return;
  }
  local_38 = *idout;
  uVar3 = (ulong)local_38 >> 0x20;
  pcVar4 = (csp_iface_t *)0x0;
  bVar6 = false;
  while( true ) {
    pcVar4 = csp_iflist_get_by_subnet((uint16_t)uVar3,pcVar4);
    if (pcVar4 == (csp_iface_t *)0x0) break;
    if (pcVar4 != routed_from) {
      iVar1 = csp_iflist_is_within_subnet(pcVar4->addr,routed_from);
      if (iVar1 == 0) {
        if ((routed_from == (csp_iface_t *)0x0) && (idout->src == 0)) {
          local_38.src = pcVar4->addr;
        }
        iVar1 = csp_id_is_broadcast(idout->dst,pcVar4);
        if (iVar1 != 0) {
          uVar2 = csp_id_get_max_nodeid();
          local_38.dst = (uint16_t)uVar2;
        }
        pcVar5 = (csp_packet_t *)csp_buffer_clone(packet);
        if (pcVar5 != (csp_packet_t *)0x0) {
          csp_send_direct_iface(&local_38,pcVar5,pcVar4,0xffff,from_me);
        }
      }
    }
    uVar3 = (ulong)idout->dst;
    bVar6 = true;
  }
  if (!bVar6) {
    pcVar4 = (csp_iface_t *)0x0;
    while( true ) {
      pcVar4 = csp_iflist_get_by_isdfl(pcVar4);
      if (pcVar4 == (csp_iface_t *)0x0) break;
      if (pcVar4 != routed_from) {
        iVar1 = csp_iflist_is_within_subnet(pcVar4->addr,routed_from);
        if (iVar1 == 0) {
          if ((routed_from == (csp_iface_t *)0x0) && (idout->src == 0)) {
            idout->src = pcVar4->addr;
          }
          pcVar5 = (csp_packet_t *)csp_buffer_clone(packet);
          if (pcVar5 != (csp_packet_t *)0x0) {
            csp_send_direct_iface(idout,pcVar5,pcVar4,0xffff,from_me);
          }
        }
      }
    }
  }
  csp_buffer_free(packet);
  return;
}

Assistant:

void csp_send_direct(csp_id_t* idout, csp_packet_t * packet, csp_iface_t * routed_from) {

	int from_me = (routed_from == NULL ? 1 : 0);

	/* Try to find the destination on any local subnets */
	int via = CSP_NO_VIA_ADDRESS;
	csp_iface_t * iface = NULL;
	csp_packet_t * copy = NULL;
	int local_found = 0;

	/* Quickly send on loopback */
	if(idout->dst == csp_if_lo.addr){
		csp_send_direct_iface(idout, packet, &csp_if_lo, via, from_me);
		return;
	}

	/* Make copy as broadcast modifies destination making iflist_get_by_subnet the skip next redundant ifaces */
	csp_id_t _idout = *idout;

	while ((iface = csp_iflist_get_by_subnet(idout->dst, iface)) != NULL) {

		local_found = 1;

		/* Do not send back to same inteface (split horizon)
		 * This check is is similar to that below, but faster */
		if (iface == routed_from) {
			continue;
		}

		/* Do not send to interface with similar subnet (split horizon) */
		if (csp_iflist_is_within_subnet(iface->addr, routed_from)) {
			continue;
		}

		/* Apply outgoing interface address to packet */
		if ((from_me) && (idout->src == 0)) {
			_idout.src = iface->addr;
		}

		/* Rewrite routed brodcast (L3) to local (L2) when arriving at the interface */
		if (csp_id_is_broadcast(idout->dst, iface)) {
			_idout.dst = csp_id_get_max_nodeid();
		}

		/* Todo: Find an elegant way to avoid making a copy when only a single destination interface
		 * is found. But without looping the list twice. And without using stack memory.
		 * Is this even possible? */
		copy = csp_buffer_clone(packet);
		if (copy != NULL) {
			csp_send_direct_iface(&_idout, copy, iface, via, from_me);
		}

	}

	/* If the above worked, we don't want to look at the routing table */
	if (local_found == 1) {
		csp_buffer_free(packet);
		return;
	}

#if CSP_USE_RTABLE
	/* Try to send via routing table */
	int route_found = 0;
	csp_route_t * route = csp_rtable_find_route(idout->dst);
	if (route != NULL) {
		do {
			route_found = 1;

			/* Do not send back to same inteface (split horizon)
			* This check is is similar to that below, but faster */
			if (route->iface == routed_from) {
				continue;
			}

			/* Do not send to interface with similar subnet (split horizon) */
			if (csp_iflist_is_within_subnet(route->iface->addr, routed_from)) {
				continue;
			}

			/* Apply outgoing interface address to packet */
			if ((from_me) && (idout->src == 0)) {
				idout->src = route->iface->addr;
			}

			copy = csp_buffer_clone(packet);
			if (copy != NULL) {
				csp_send_direct_iface(idout, copy, route->iface, route->via, from_me);
			}
		} while ((route = csp_rtable_search_backward(route)) != NULL);
	}

	/* If the above worked, we don't want to look at default interfaces */
	if (route_found == 1) {
		csp_buffer_free(packet);
		return;
	}

#endif

	/* Try to send via default interfaces */
	while ((iface = csp_iflist_get_by_isdfl(iface)) != NULL) {

		/* Do not send back to same inteface (split horizon)
		 * This check is is similar to that below, but faster */
		if (iface == routed_from) {
			continue;
		}

		/* Do not send to interface with similar subnet (split horizon) */
		if (csp_iflist_is_within_subnet(iface->addr, routed_from)) {
			continue;
		}

		/* Apply outgoing interface address to packet */
		if ((from_me) && (idout->src == 0)) {
			idout->src = iface->addr;
		}

		/* Todo: Find an elegant way to avoid making a copy when only a single destination interface
		 * is found. But without looping the list twice. And without using stack memory.
		 * Is this even possible? */
		copy = csp_buffer_clone(packet);
		if (copy != NULL) {
			csp_send_direct_iface(idout, copy, iface, via, from_me);
		}

	}

	csp_buffer_free(packet);

}